

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::initializeLater(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar3;
  ulong uVar4;
  string token;
  time_t now;
  string local_90;
  string local_70;
  string local_50;
  
  previous = Pig::cursor(pig);
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"later","");
  bVar1 = Pig::skipPartial(pig,&local_70,&local_90,false);
  if ((bVar1) && ((ulong)(long)minimumMatchLength <= local_90._M_string_length)) {
    bVar2 = true;
    bVar1 = false;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"someday","");
    bVar2 = Pig::skipPartial(pig,&local_50,&local_90,false);
    bVar1 = true;
    if (bVar2) {
      uVar4 = 4;
      if (4 < minimumMatchLength) {
        uVar4 = (ulong)(uint)minimumMatchLength;
      }
      bVar2 = uVar4 <= local_90._M_string_length;
    }
    else {
      bVar2 = false;
    }
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    c = Pig::peek(pig);
    bVar1 = unicodeLatinAlpha(c);
    if (!bVar1) {
      bVar1 = unicodeLatinDigit(c);
      if (!bVar1) {
        local_70._M_dataplus._M_p = (pointer)time((time_t *)0x0);
        __tp = localtime((time_t *)&local_70);
        __tp->tm_sec = 0;
        __tp->tm_min = 0;
        __tp->tm_hour = 0;
        __tp->tm_year = 0x1fa3;
        __tp->tm_mday = 0x1e;
        __tp->tm_mon = 0xb;
        __tp->tm_isdst = -1;
        tVar3 = mktime(__tp);
        this->_date = tVar3;
        bVar1 = true;
        goto LAB_0010b0b4;
      }
    }
  }
  Pig::restoreTo(pig,previous);
  bVar1 = false;
LAB_0010b0b4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool Datetime::initializeLater (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if ((pig.skipPartial ("later", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))

      ||

     (pig.skipPartial ("someday", token) &&
      token.length () >= static_cast <std::string::size_type> (std::max (Datetime::minimumMatchLength, 4))))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_year = 8099;  // Year 9999
      t->tm_mon = 11;
      t->tm_mday = 30;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}